

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

int Aig_ManCoCleanup(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  int local_20;
  int nPosOld;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  iVar1 = Aig_ManCoNum(p);
  for (nPosOld = 0; iVar2 = Vec_PtrSize(p->vCos), nPosOld < iVar2; nPosOld = nPosOld + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nPosOld);
    iVar2 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    if (nPosOld < iVar2 - iVar3) {
      pObj_01 = Aig_ObjFanin0(pObj_00);
      iVar2 = Aig_ObjIsConst1(pObj_01);
      if ((iVar2 == 0) || (iVar2 = Aig_ObjFaninC0(pObj_00), iVar2 == 0)) {
        Vec_PtrWriteEntry(p->vCos,local_20,pObj_00);
        local_20 = local_20 + 1;
      }
      else {
        Aig_ObjDisconnect(p,pObj_00);
        Vec_PtrWriteEntry(p->vObjs,pObj_00->Id,(void *)0x0);
      }
    }
    else {
      Vec_PtrWriteEntry(p->vCos,local_20,pObj_00);
      local_20 = local_20 + 1;
    }
  }
  Vec_PtrShrink(p->vCos,local_20);
  iVar2 = Vec_PtrSize(p->vCos);
  p->nObjs[3] = iVar2;
  iVar2 = Aig_ManRegNum(p);
  if (iVar2 != 0) {
    iVar2 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    p->nTruePos = iVar2 - iVar3;
  }
  iVar2 = Aig_ManCoNum(p);
  return iVar1 - iVar2;
}

Assistant:

int Aig_ManCoCleanup( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k = 0, nPosOld = Aig_ManCoNum(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vCos, pObj, i )
    {
        if ( i >= Aig_ManCoNum(p) - Aig_ManRegNum(p) )
            Vec_PtrWriteEntry( p->vCos, k++, pObj );
        else if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) || !Aig_ObjFaninC0(pObj) ) // non-const or const1
            Vec_PtrWriteEntry( p->vCos, k++, pObj );
        else
        {
            Aig_ObjDisconnect( p, pObj );
            Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        }
    }
    Vec_PtrShrink( p->vCos, k );
    p->nObjs[AIG_OBJ_CO] = Vec_PtrSize( p->vCos );
    if ( Aig_ManRegNum(p) )
        p->nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p);
    return nPosOld - Aig_ManCoNum(p);
}